

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yy_2_param(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPParserContext *parser;
  PVIPNode *pPVar1;
  PVIPNode *pPVar2;
  PVIPNode *n2;
  uint uVar3;
  PVIPNode *pPVar4;
  PVIPNode **ppPVar5;
  PVIPNode *n3;
  PVIPNode *pPVar6;
  uint uVar7;
  
  ppPVar5 = G->val;
  pPVar4 = ppPVar5[-6];
  pPVar6 = ppPVar5[-3];
  pPVar1 = ppPVar5[-2];
  pPVar2 = ppPVar5[-1];
  parser = &G->data;
  if (pPVar4 == (PVIPNode *)0x0) {
    pPVar4 = PVIP_node_new_children(parser,PVIP_NODE_NOP);
    ppPVar5 = G->val;
  }
  n2 = ppPVar5[-5];
  n3 = ppPVar5[-4];
  if (n3 == (PVIPNode *)0x0) {
    n3 = PVIP_node_new_children(parser,PVIP_NODE_NOP);
  }
  uVar7 = (pPVar6 != (PVIPNode *)0x0) + 2;
  if (pPVar1 == (PVIPNode *)0x0) {
    uVar7 = (uint)(pPVar6 != (PVIPNode *)0x0);
  }
  uVar3 = uVar7 + 4;
  if (pPVar2 == (PVIPNode *)0x0) {
    uVar3 = uVar7;
  }
  pPVar6 = PVIP_node_new_int(parser,PVIP_NODE_INT,(ulong)uVar3);
  pPVar4 = PVIP_node_new_children4(parser,PVIP_NODE_PARAM,pPVar4,n2,n3,pPVar6);
  G->ss = pPVar4;
  return;
}

Assistant:

YY_ACTION(void) yy_2_param(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define is_ref G->val[-1]
#define is_rw G->val[-2]
#define is_copy G->val[-3]
#define d G->val[-4]
#define v G->val[-5]
#define i G->val[-6]
  yyprintf((stderr, "do yy_2_param"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
        int attr = 0;\n\
        if (is_copy) {\n\
            attr |= PVIP_FUNC_ATTR_IS_COPY;\n\
        }\n\
        if (is_rw) {\n\
            attr |= PVIP_FUNC_ATTR_IS_RW;\n\
        }\n\
        if (is_ref) {\n\
            attr |= PVIP_FUNC_ATTR_IS_REF;\n\
        }\n\
        yy = CHILDREN4(PVIP_NODE_PARAM, MAYBE(i), v, MAYBE(d), PVIP_node_new_int(&(G->data), PVIP_NODE_INT, attr));\n\
    }\n"));
  
        int attr = 0;
        if (is_copy) {
            attr |= PVIP_FUNC_ATTR_IS_COPY;
        }
        if (is_rw) {
            attr |= PVIP_FUNC_ATTR_IS_RW;
        }
        if (is_ref) {
            attr |= PVIP_FUNC_ATTR_IS_REF;
        }
        yy = CHILDREN4(PVIP_NODE_PARAM, MAYBE(i), v, MAYBE(d), PVIP_node_new_int(&(G->data), PVIP_NODE_INT, attr));
    ;
#undef is_ref
#undef is_rw
#undef is_copy
#undef d
#undef v
#undef i
}